

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,xmlSchemaTypePtr type)

{
  xmlSchemaContentType xVar1;
  xmlSchemaTypePtr pxVar2;
  void *item;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  xmlChar *pxVar6;
  xmlChar *str2;
  xmlNodePtr node;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  xmlSchemaItemListPtr list;
  bool bVar13;
  xmlChar *str;
  xmlChar *local_58;
  int local_4c;
  xmlSchemaTypePtr local_48;
  xmlChar *local_40;
  xmlSchemaItemListPtr local_38;
  
  pxVar2 = type->baseType;
  if ((pxVar2 == (xmlSchemaTypePtr)0x0) ||
     (((pxVar2->type != XML_SCHEMA_TYPE_SIMPLE &&
       ((pxVar2->type != XML_SCHEMA_TYPE_BASIC || (pxVar2->builtInType == 0x2d)))) ||
      ((type->flags & 2) != 0)))) {
    list = (xmlSchemaItemListPtr)type->attrUses;
    iVar3 = 0;
    if (list != (xmlSchemaItemListPtr)0x0) {
      uVar10 = list->nbItems;
      iVar3 = 0;
      if (1 < (long)(int)uVar10) {
        uVar7 = uVar10 - 2;
        local_4c = 0;
        uVar11 = (long)(int)uVar10;
        local_48 = type;
        local_38 = list;
        do {
          uVar10 = uVar10 - 1;
          uVar12 = uVar11 - 1;
          item = list->items[uVar11 - 1];
          if (1 < (long)uVar11) {
            ppvVar5 = list->items + uVar7;
            type = (xmlSchemaTypePtr)(ulong)uVar10;
            do {
              if ((*(long *)(*(long *)((long)item + 0x18) + 0x10) ==
                   *(long *)(*(long *)((long)*ppvVar5 + 0x18) + 0x10)) &&
                 (*(long *)(*(long *)((long)item + 0x18) + 0x70) ==
                  *(long *)(*(long *)((long)*ppvVar5 + 0x18) + 0x70))) {
                local_58 = (xmlChar *)0x0;
                pxVar6 = xmlSchemaGetComponentDesignation(&local_58,item);
                xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                                    (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)local_48,"Duplicate %s",
                                    pxVar6,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
                if (local_58 != (xmlChar *)0x0) {
                  (*xmlFree)(local_58);
                  local_58 = (xmlChar *)0x0;
                }
                type = (xmlSchemaTypePtr)(uVar12 & 0xffffffff);
                iVar3 = xmlSchemaItemListRemove(list,(int)uVar12);
                if (iVar3 != -1) goto LAB_001a3c60;
                bVar13 = true;
                goto LAB_001a3c71;
              }
              uVar8 = (int)type - 1;
              type = (xmlSchemaTypePtr)(ulong)uVar8;
              ppvVar5 = ppvVar5 + -1;
            } while (0 < (int)uVar8);
          }
          pxVar2 = *(xmlSchemaTypePtr *)(*(long *)((long)item + 0x18) + 0x60);
          if ((pxVar2 != (xmlSchemaTypePtr)0x0) &&
             (iVar3 = xmlSchemaIsDerivedFromBuiltInType(pxVar2,(int)type), iVar3 != 0)) {
            if (local_4c == 0) {
              local_4c = 1;
            }
            else {
              local_58 = (xmlChar *)0x0;
              pxVar6 = xmlSchemaGetComponentDesignation(&local_58,item);
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                                  (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)local_48,
                                  "There must not exist more than one attribute declaration of type \'xs:ID\' (or derived from \'xs:ID\'). The %s violates this constraint"
                                  ,pxVar6,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
              if (local_58 != (xmlChar *)0x0) {
                (*xmlFree)(local_58);
                local_58 = (xmlChar *)0x0;
              }
              list = local_38;
              type = (xmlSchemaTypePtr)(uVar12 & 0xffffffff);
              iVar3 = xmlSchemaItemListRemove(local_38,(int)uVar12);
              local_4c = 1;
              bVar13 = iVar3 == -1;
              if (bVar13) goto LAB_001a3c71;
            }
          }
LAB_001a3c60:
          uVar7 = uVar7 - 1;
          bVar13 = 1 < (long)uVar11;
          uVar11 = uVar12;
        } while (bVar13);
        bVar13 = false;
LAB_001a3c71:
        iVar3 = -(uint)bVar13;
        type = local_48;
      }
    }
  }
  else {
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_CT_1,(xmlNodePtr)0x0,
                        (xmlSchemaBasicItemPtr)type,
                        "If the base type is a simple type, the derivation method must be \'extension\'"
                        ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    iVar3 = 0xc04;
  }
  if (iVar3 != 0) {
    return iVar3;
  }
  pxVar2 = type->baseType;
  if ((type->flags & 2) != 0) {
    if ((pxVar2->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar2->builtInType == 0x2d)) {
      if ((pxVar2->flags & 0x200) == 0) {
        if ((type->contentTypeDef != (xmlSchemaTypePtr)0x0) &&
           (type->contentTypeDef == pxVar2->contentTypeDef)) {
          return 0;
        }
        xVar1 = type->contentType;
        if ((xVar1 == XML_SCHEMA_CONTENT_EMPTY) && (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY)
           ) {
          return 0;
        }
        if (type->subtypes == (xmlSchemaTypePtr)0x0) {
          pcVar9 = "The content type must specify a particle";
        }
        else {
          if (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY) {
            return 0;
          }
          if ((xVar1 & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS &&
              pxVar2->contentType == xVar1) {
            return 0;
          }
          pcVar9 = 
          "The content type of both, the type and its base type, must either \'mixed\' or \'element-only\'"
          ;
        }
        goto LAB_001a3f42;
      }
    }
    else {
      if (type->contentTypeDef != pxVar2) {
        pcVar9 = "The content type must be the simple base type";
        goto LAB_001a3f42;
      }
      if ((pxVar2->flags & 0x200) == 0) {
        return 0;
      }
    }
    pcVar9 = "The \'final\' of the base type definition contains \'extension\'";
LAB_001a3f42:
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_COS_CT_EXTENDS_1_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
               pcVar9,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
    return 0xbf7;
  }
  if ((pxVar2->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar2->builtInType == 0x2d)) {
    if ((pxVar2->flags & 0x400) == 0) {
      iVar3 = xmlSchemaCheckDerivationOKRestriction2to4
                        (ctxt,0,(xmlSchemaBasicItemPtr)type,(xmlSchemaBasicItemPtr)pxVar2,
                         (xmlSchemaItemListPtr)type->attrUses,(xmlSchemaItemListPtr)pxVar2->attrUses
                         ,type->attributeWildcard,pxVar2->attributeWildcard);
      if (iVar3 == -1) {
        return -1;
      }
      if (pxVar2->builtInType == 0x2d) {
LAB_001a3c7f:
        return 0;
      }
      switch(type->contentType) {
      case XML_SCHEMA_CONTENT_EMPTY:
        if (pxVar2->contentType - XML_SCHEMA_CONTENT_ELEMENTS < 2) {
          iVar3 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar2->subtypes);
          if (iVar3 != 0) {
            return 0;
          }
        }
        else if (pxVar2->contentType == XML_SCHEMA_CONTENT_EMPTY) {
          return 0;
        }
        pcVar9 = 
        "The content type of the base type must be either empty or \'mixed\' (or \'elements-only\') and an emptiable particle"
        ;
        break;
      case XML_SCHEMA_CONTENT_ELEMENTS:
        goto LAB_001a3c7f;
      case XML_SCHEMA_CONTENT_MIXED:
        if (pxVar2->contentType == XML_SCHEMA_CONTENT_MIXED) {
          return 0;
        }
        pcVar9 = 
        "If the content type is \'mixed\', then the content type of the base type must also be \'mixed\'"
        ;
        break;
      case XML_SCHEMA_CONTENT_SIMPLE:
      case XML_SCHEMA_CONTENT_BASIC:
        xVar1 = pxVar2->contentType;
        if (xVar1 == XML_SCHEMA_CONTENT_MIXED) {
          iVar3 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar2->subtypes);
          if (iVar3 != 0) {
            return 0;
          }
        }
        else if ((xVar1 == XML_SCHEMA_CONTENT_BASIC) || (xVar1 == XML_SCHEMA_CONTENT_SIMPLE)) {
          iVar4 = xmlSchemaCheckCOSSTDerivedOK
                            ((xmlSchemaAbstractCtxtPtr)ctxt,type->contentTypeDef,
                             pxVar2->contentTypeDef,0);
          iVar3 = 0;
          if (iVar4 != 0) {
            local_58 = (xmlChar *)0x0;
            local_40 = (xmlChar *)0x0;
            if (iVar4 == -1) {
              iVar3 = -1;
            }
            else {
              pxVar6 = xmlSchemaGetComponentDesignation(&local_58,type->contentTypeDef);
              str2 = xmlSchemaGetComponentDesignation(&local_40,pxVar2->contentTypeDef);
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,
                                  XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,(xmlNodePtr)0x0,
                                  (xmlSchemaBasicItemPtr)type,
                                  "The {content type} %s is not validly derived from the base type\'s {content type} %s"
                                  ,pxVar6,str2,(xmlChar *)0x0,(xmlChar *)0x0);
              if (local_58 != (xmlChar *)0x0) {
                (*xmlFree)(local_58);
                local_58 = (xmlChar *)0x0;
              }
              if (local_40 != (xmlChar *)0x0) {
                (*xmlFree)(local_40);
              }
              iVar3 = ctxt->err;
            }
          }
          if (iVar4 == 0) {
            return 0;
          }
          return iVar3;
        }
        pcVar9 = 
        "The content type of the base type must be either a simple type or \'mixed\' and an emptiable particle"
        ;
        break;
      default:
        pcVar9 = "The type is not a valid restriction of its base type";
      }
      xmlSchemaPCustomErrExt
                (ctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,(xmlSchemaBasicItemPtr)type,
                 (xmlNodePtr)0x0,pcVar9,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_001a3ef4;
    }
    node = type->node;
    pcVar9 = "The \'final\' of the base type definition contains \'restriction\'";
  }
  else {
    node = type->node;
    pcVar9 = "The base type must be a complex type";
  }
  xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,node,
                      (xmlSchemaBasicItemPtr)type,pcVar9,(xmlChar *)0x0,(xmlChar *)0x0,
                      (xmlChar *)0x0,(xmlChar *)0x0);
LAB_001a3ef4:
  return ctxt->err;
}

Assistant:

static int
xmlSchemaCheckCTComponent(xmlSchemaParserCtxtPtr ctxt,
			  xmlSchemaTypePtr type)
{
    int ret;
    /*
    * Complex Type Definition Properties Correct
    */
    ret = xmlSchemaCheckCTPropsCorrect(ctxt, type);
    if (ret != 0)
	return (ret);
    if (WXS_IS_EXTENSION(type))
	ret = xmlSchemaCheckCOSCTExtends(ctxt, type);
    else
	ret = xmlSchemaCheckDerivationOKRestriction(ctxt, type);
    return (ret);
}